

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

size_t __thiscall
MADPComponentDiscreteActions::GetNrActions(MADPComponentDiscreteActions *this,Index agentI)

{
  pointer puVar1;
  undefined8 *puVar2;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  puVar1 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)agentI <
      (ulong)((long)(this->_m_nrActions).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return puVar1[agentI];
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,
             "Warning: MADPComponentDiscreteActions::GetNrActions(Index agentI) - index out of bounds"
             ,0x57);
  std::endl<char,std::char_traits<char>>(local_188);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrActions(Index agentI) const
{    
    if(agentI < _m_nrActions.size())
        return _m_nrActions[agentI];
    else
    {
        stringstream ss;
            ss << "Warning: MADPComponentDiscreteActions::GetNrActions(Index agentI) - index out of bounds"<<endl;
        throw E(ss);
    }
}